

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_obj.cc
# Opt level: O2

char * X509_NAME_oneline(X509_NAME *a,char *buf,int size)

{
  byte bVar1;
  uint *puVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  X509_NAME *pXVar7;
  int iVar8;
  BUF_MEM *str;
  undefined4 extraout_var;
  size_t sVar9;
  undefined8 *puVar10;
  char *pcVar11;
  size_t sVar12;
  undefined4 extraout_var_00;
  char *pcVar13;
  byte *pbVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *__dest;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b0;
  BUF_MEM *local_a8;
  ulong local_a0;
  X509_NAME *local_98;
  ulong local_90;
  char tmp_buf [80];
  
  if (buf == (char *)0x0) {
    str = BUF_MEM_new();
    if (str == (BUF_MEM *)0x0) {
      str = (BUF_MEM *)0x0;
    }
    else {
      iVar8 = BUF_MEM_grow(str,200);
      if (CONCAT44(extraout_var,iVar8) != 0) {
        *str->data = '\0';
        if (a == (X509_NAME *)0x0) {
          buf = str->data;
          OPENSSL_free(str);
          size = 200;
          goto LAB_0041735f;
        }
        local_cc = 200;
        local_a8 = str;
        goto LAB_004170d1;
      }
    }
LAB_00417375:
    BUF_MEM_free(str);
  }
  else if (0 < size) {
    if (a == (X509_NAME *)0x0) {
LAB_0041735f:
      OPENSSL_strlcpy(buf,"NO X509_NAME",(ulong)(uint)size);
      return buf;
    }
    local_a8 = (BUF_MEM *)0x0;
    local_cc = size;
LAB_004170d1:
    uVar16 = 0;
    uVar18 = 0;
    local_b0 = buf;
    local_98 = a;
    do {
      pXVar7 = local_98;
      sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)local_98->entries);
      if (sVar9 <= uVar16) {
        if (local_a8 != (BUF_MEM *)0x0) {
          pcVar11 = local_a8->data;
          OPENSSL_free(local_a8);
          local_b0 = pcVar11;
        }
LAB_0041739b:
        if (uVar16 != 0) {
          return local_b0;
        }
        *local_b0 = '\0';
        return local_b0;
      }
      local_a0 = uVar16;
      puVar10 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar7->entries,uVar16);
      iVar8 = OBJ_obj2nid((ASN1_OBJECT *)*puVar10);
      if ((iVar8 == 0) || (pcVar11 = OBJ_nid2sn(iVar8), pcVar11 == (char *)0x0)) {
        pcVar11 = tmp_buf;
        i2t_ASN1_OBJECT(pcVar11,0x50,(ASN1_OBJECT *)*puVar10);
      }
      sVar12 = strlen(pcVar11);
      puVar2 = (uint *)puVar10[1];
      uVar15 = *puVar2;
      if (0x100000 < (int)uVar15) {
        iVar8 = 0x4f;
LAB_00417332:
        ERR_put_error(0xb,0,0x87,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_obj.cc"
                      ,iVar8);
        str = local_a8;
        goto LAB_00417375;
      }
      lVar3 = *(long *)(puVar2 + 2);
      if (((uVar15 & 3) == 0) && (puVar2[1] == 0x1b)) {
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        uVar17 = (ulong)uVar15;
        local_c8 = 0;
        uStack_c0 = 0;
        for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
          if (*(char *)(lVar3 + uVar16) != '\0') {
            *(undefined4 *)((long)&local_c8 + (ulong)((uint)uVar16 & 3) * 4) = 1;
          }
        }
        bVar5 = local_c8._4_4_ != 0;
        bVar6 = (int)local_c8 != 0;
        bVar4 = (int)uStack_c0 != 0;
        local_c8 = (ulong)CONCAT14((bVar5 || bVar6) || bVar4,(uint)((bVar5 || bVar6) || bVar4));
        uStack_c0 = CONCAT44(1,(uint)((bVar5 || bVar6) || bVar4));
      }
      else {
        local_c8 = 0x100000001;
        uStack_c0 = 0x100000001;
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        uVar17 = (ulong)uVar15;
      }
      str = local_a8;
      iVar8 = 0;
      for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        if (*(int *)((long)&local_c8 + (ulong)((uint)uVar16 & 3) * 4) != 0) {
          iVar8 = iVar8 + (uint)((byte)(*(char *)(lVar3 + uVar16) + 0x81U) < 0xa1) * 3 + 1;
        }
      }
      iVar8 = iVar8 + (int)uVar18 + (int)sVar12;
      uVar15 = iVar8 + 2;
      if (0x100000 < (int)uVar15) {
        iVar8 = 0x73;
        goto LAB_00417332;
      }
      local_90 = (ulong)uVar15;
      if (local_a8 == (BUF_MEM *)0x0) {
        pcVar13 = local_b0;
        uVar16 = local_a0;
        if (local_cc <= (int)uVar15) goto LAB_0041739b;
      }
      else {
        iVar8 = BUF_MEM_grow(local_a8,(long)(iVar8 + 3));
        if (CONCAT44(extraout_var_00,iVar8) == 0) goto LAB_00417375;
        pcVar13 = str->data;
      }
      pcVar13 = pcVar13 + (int)uVar18;
      __dest = pcVar13 + 1;
      *pcVar13 = '/';
      if ((sVar12 & 0xffffffff) != 0) {
        memcpy(__dest,pcVar11,sVar12 & 0xffffffff);
      }
      pbVar14 = (byte *)(__dest + (int)sVar12 + 1);
      __dest[(int)sVar12] = '=';
      lVar3 = *(long *)(puVar10[1] + 8);
      for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        if (*(int *)((long)&local_c8 + (ulong)((uint)uVar16 & 3) * 4) != 0) {
          bVar1 = *(byte *)(lVar3 + uVar16);
          if ((byte)(bVar1 + 0x81) < 0xa1) {
            pbVar14[0] = 0x5c;
            pbVar14[1] = 0x78;
            pbVar14[2] = "0123456789ABCDEF"[bVar1 >> 4];
            pbVar14[3] = "0123456789ABCDEF"[bVar1 & 0xf];
            pbVar14 = pbVar14 + 4;
          }
          else {
            *pbVar14 = bVar1;
            pbVar14 = pbVar14 + 1;
          }
        }
      }
      *pbVar14 = 0;
      uVar16 = local_a0 + 1;
      uVar18 = local_90;
    } while( true );
  }
  return (char *)0x0;
}

Assistant:

char *X509_NAME_oneline(const X509_NAME *a, char *buf, int len) {
  X509_NAME_ENTRY *ne;
  size_t i;
  int n, lold, l, l1, l2, num, j, type;
  const char *s;
  char *p;
  unsigned char *q;
  BUF_MEM *b = NULL;
  static const char hex[17] = "0123456789ABCDEF";
  int gs_doit[4];
  char tmp_buf[80];

  if (buf == NULL) {
    if ((b = BUF_MEM_new()) == NULL) {
      goto err;
    }
    if (!BUF_MEM_grow(b, 200)) {
      goto err;
    }
    b->data[0] = '\0';
    len = 200;
  } else if (len <= 0) {
    return NULL;
  }
  if (a == NULL) {
    if (b) {
      buf = b->data;
      OPENSSL_free(b);
    }
    OPENSSL_strlcpy(buf, "NO X509_NAME", len);
    return buf;
  }

  len--;  // space for '\0'
  l = 0;
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    ne = sk_X509_NAME_ENTRY_value(a->entries, i);
    n = OBJ_obj2nid(ne->object);
    if ((n == NID_undef) || ((s = OBJ_nid2sn(n)) == NULL)) {
      i2t_ASN1_OBJECT(tmp_buf, sizeof(tmp_buf), ne->object);
      s = tmp_buf;
    }
    l1 = strlen(s);

    type = ne->value->type;
    num = ne->value->length;
    if (num > NAME_ONELINE_MAX) {
      OPENSSL_PUT_ERROR(X509, X509_R_NAME_TOO_LONG);
      goto err;
    }
    q = ne->value->data;

    if ((type == V_ASN1_GENERALSTRING) && ((num % 4) == 0)) {
      gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 0;
      for (j = 0; j < num; j++) {
        if (q[j] != 0) {
          gs_doit[j & 3] = 1;
        }
      }

      if (gs_doit[0] | gs_doit[1] | gs_doit[2]) {
        gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 1;
      } else {
        gs_doit[0] = gs_doit[1] = gs_doit[2] = 0;
        gs_doit[3] = 1;
      }
    } else {
      gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 1;
    }

    for (l2 = j = 0; j < num; j++) {
      if (!gs_doit[j & 3]) {
        continue;
      }
      l2++;
      if ((q[j] < ' ') || (q[j] > '~')) {
        l2 += 3;
      }
    }

    lold = l;
    l += 1 + l1 + 1 + l2;
    if (l > NAME_ONELINE_MAX) {
      OPENSSL_PUT_ERROR(X509, X509_R_NAME_TOO_LONG);
      goto err;
    }
    if (b != NULL) {
      if (!BUF_MEM_grow(b, l + 1)) {
        goto err;
      }
      p = &(b->data[lold]);
    } else if (l > len) {
      break;
    } else {
      p = &(buf[lold]);
    }
    *(p++) = '/';
    OPENSSL_memcpy(p, s, (unsigned int)l1);
    p += l1;
    *(p++) = '=';

    q = ne->value->data;

    for (j = 0; j < num; j++) {
      if (!gs_doit[j & 3]) {
        continue;
      }
      n = q[j];
      if ((n < ' ') || (n > '~')) {
        *(p++) = '\\';
        *(p++) = 'x';
        *(p++) = hex[(n >> 4) & 0x0f];
        *(p++) = hex[n & 0x0f];
      } else {
        *(p++) = n;
      }
    }
    *p = '\0';
  }
  if (b != NULL) {
    p = b->data;
    OPENSSL_free(b);
  } else {
    p = buf;
  }
  if (i == 0) {
    *p = '\0';
  }
  return p;
err:
  BUF_MEM_free(b);
  return NULL;
}